

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidCrop3(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_long> *this;
  pointer pcVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  Type *pTVar7;
  ArrayFeatureType_EnumeratedShapes *pAVar8;
  Rep *pRVar9;
  ArrayFeatureType *pAVar10;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  WeightParams *pWVar11;
  ostream *poVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_78 + 0x10;
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
  }
  if (pAVar10->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar10->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar10);
    pAVar10->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar10->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 6;
  pTVar7->upperbound_ = 6;
  if (pAVar10->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar10->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar10);
    pAVar10->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar10->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 100;
  pTVar7->upperbound_ = 1000;
  if (pAVar10->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar10->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar10);
    pAVar10->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar10->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 5;
  pTVar7->upperbound_ = 0xf;
  pRVar1 = &pAVar10->shape_;
  iVar14 = (pAVar10->shape_).current_size_;
  iVar15 = (pAVar10->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar10->shape_).current_size_;
    iVar15 = (pAVar10->shape_).total_size_;
  }
  pRVar9 = (pAVar10->shape_).rep_;
  iVar13 = iVar14 + 1;
  (pAVar10->shape_).current_size_ = iVar13;
  pRVar9->elements[iVar14] = 0xea;
  if (iVar13 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar13 = (pAVar10->shape_).current_size_;
    pRVar9 = (pAVar10->shape_).rep_;
  }
  pRVar1->current_size_ = iVar13 + 1;
  pRVar9->elements[iVar13] = 0x14c;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
  }
  pRVar1 = &pAVar10->shape_;
  iVar15 = (pAVar10->shape_).current_size_;
  iVar14 = (pAVar10->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar10->shape_).current_size_;
    iVar14 = (pAVar10->shape_).total_size_;
  }
  pRVar9 = (pAVar10->shape_).rep_;
  iVar13 = iVar15 + 1;
  (pAVar10->shape_).current_size_ = iVar13;
  pRVar9->elements[iVar15] = 2;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar13 = (pAVar10->shape_).current_size_;
    iVar14 = (pAVar10->shape_).total_size_;
    pRVar9 = (pAVar10->shape_).rep_;
  }
  iVar15 = iVar13 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar9->elements[iVar13] = 10;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 2);
    iVar15 = (pAVar10->shape_).current_size_;
    pRVar9 = (pAVar10->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar9->elements[iVar15] = 0xb;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] == 0xbe) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0xbe;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::CropLayerParams::CropLayerParams(this_02.crop_);
    (this_01->layer_).crop_ = (CropLayerParams *)this_02;
  }
  this = &(this_02.convolution_)->kernelsize_;
  iVar15 = ((this_02.convolution_)->kernelsize_).current_size_;
  iVar14 = ((this_02.convolution_)->kernelsize_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar15 + 1);
    iVar15 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar14 = ((this_02.convolution_)->kernelsize_).total_size_;
  }
  pWVar11 = (this_02.innerproduct_)->bias_;
  iVar13 = iVar15 + 1;
  ((this_02.convolution_)->kernelsize_).current_size_ = iVar13;
  (&pWVar11->_internal_metadata_)[iVar15].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar15 + 2);
    iVar13 = ((this_02.convolution_)->kernelsize_).current_size_;
    pWVar11 = (this_02.innerproduct_)->bias_;
  }
  this->current_size_ = iVar13 + 1;
  (&pWVar11->_internal_metadata_)[iVar13].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x2;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xeef);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar3;
}

Assistant:

int testInvalidCrop3() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *chanShape = shape->mutable_shaperange()->add_sizeranges();
    chanShape->set_lowerbound(6);
    chanShape->set_upperbound(6);
    auto *heightRange = shape->mutable_shaperange()->add_sizeranges();
    heightRange->set_lowerbound(100);
    heightRange->set_upperbound(1000);
    auto *widthRange = shape->mutable_shaperange()->add_sizeranges();
    widthRange->set_lowerbound(5);
    widthRange->set_upperbound(15);


    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}